

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

aiTextureMapMode GetMapMode(Wrap in)

{
  Logger *this;
  
  if (in == RESET) {
    this = Assimp::DefaultLogger::get();
    Assimp::Logger::warn(this,"LWO2: Unsupported texture map mode: RESET");
  }
  else if (in != EDGE) {
    if (in != MIRROR) {
      return aiTextureMapMode_Wrap;
    }
    return aiTextureMapMode_Mirror;
  }
  return aiTextureMapMode_Clamp;
}

Assistant:

inline aiTextureMapMode GetMapMode(LWO::Texture::Wrap in)
{
    switch (in)
    {
        case LWO::Texture::REPEAT:
            return aiTextureMapMode_Wrap;

        case LWO::Texture::MIRROR:
            return aiTextureMapMode_Mirror;

        case LWO::Texture::RESET:
            ASSIMP_LOG_WARN("LWO2: Unsupported texture map mode: RESET");

            // fall though here
        case LWO::Texture::EDGE:
            return aiTextureMapMode_Clamp;
    }
    return (aiTextureMapMode)0;
}